

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void nowtech::log::
     Log<nowtech::log::QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>,_nowtech::log::SenderStdOstream<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>,_123UL,_123U>,_(signed_char)'\x02',_(nowtech::log::TaskRepresentation)2,_0UL,_444U>
     ::transmitterTaskFunction(void)

{
  bool bVar1;
  tMessage message;
  MessageCompact<8UL,_true> local_15;
  
  do {
    if (((byte)sKeepAliveTask._M_base._M_i & 1) == 0) {
      bVar1 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
              ::empty();
      if (bVar1) {
        AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::finish();
        return;
      }
    }
    bVar1 = QueueStdBoost<nowtech::log::MessageCompact<8UL,_true>,_nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>,_444UL>
            ::pop(&local_15,0x1bc);
    if (bVar1) {
      if (local_15.mData[0xc] == '\x01') {
        LOCK();
        sTaskShutdowns->_M_elems[local_15.mData[10]]._M_base._M_i = true;
        UNLOCK();
      }
      else {
        checkAndInsertAndTransmit(local_15.mData[10],&local_15);
      }
    }
  } while( true );
}

Assistant:

static void transmitterTaskFunction() noexcept {
    while(sKeepAliveTask || !tQueue::empty()) {
      tMessage message;
      if(tQueue::pop(message, tRefreshPeriod)) {
        TaskId taskId = message.getTaskId();
        if constexpr(csSendInBackground) {
          if (message.isShutdown()) {
            (*sTaskShutdowns)[taskId] = true;
          }
          else {
            checkAndInsertAndTransmit(taskId, message);
          }
        }
        else {
          checkAndInsertAndTransmit(taskId, message);
        }
      }
      else { // nothing to do
      }
    }
    tAppInterface::finish();
  }